

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.h
# Opt level: O0

void gutil::runParallel(ParallelFunction *fct,long start,long end,long step)

{
  undefined1 auVar1 [16];
  int *piVar2;
  ThreadData *pTVar3;
  ulong uVar4;
  Thread *this;
  Thread *pTVar5;
  long in_RCX;
  Thread *pTVar6;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ulong uVar7;
  int in_stack_0000003c;
  long in_stack_00000040;
  long in_stack_00000048;
  long in_stack_00000050;
  ParallelFunction *in_stack_00000058;
  Thread *in_stack_00000060;
  int i_1;
  int i;
  Thread *thread;
  int n;
  Thread *in_stack_ffffffffffffff60;
  Thread *local_68;
  int local_44;
  int local_40;
  int local_28;
  int local_24;
  long local_20;
  long local_18;
  long local_10;
  undefined8 *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_24 = Thread::getMaxThreads();
  local_28 = (int)(((local_18 - local_10) + local_20) / local_20);
  piVar2 = std::min<int>(&local_24,&local_28);
  local_24 = *piVar2;
  if (local_24 < 2) {
    (**(code **)*local_8)(local_8,local_10,local_18,local_20);
  }
  else {
    pTVar3 = (ThreadData *)(long)local_24;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pTVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(8),0);
    uVar7 = uVar4 + 8;
    if (SUB168(auVar1 * ZEXT816(8),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar7 = 0xffffffffffffffff;
    }
    this = (Thread *)operator_new__(uVar7);
    this->p = pTVar3;
    pTVar6 = this + 1;
    if (pTVar3 != (ThreadData *)0x0) {
      local_68 = pTVar6;
      do {
        Thread::Thread(in_stack_ffffffffffffff60);
        local_68 = local_68 + 1;
      } while (local_68 != pTVar6 + (long)pTVar3);
    }
    for (local_40 = 0; local_40 < local_24; local_40 = local_40 + 1) {
      Thread::create(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
                     in_stack_00000040,in_stack_0000003c);
    }
    for (local_44 = 0; local_44 < local_24; local_44 = local_44 + 1) {
      Thread::join(in_stack_ffffffffffffff60);
    }
    if (pTVar6 != (Thread *)0x0) {
      for (pTVar5 = pTVar6 + (long)this->p; pTVar6 != pTVar5; pTVar5 = pTVar5 + -1) {
        Thread::~Thread(this);
      }
      operator_delete__(this);
    }
  }
  return;
}

Assistant:

inline void runParallel(ParallelFunction &fct, long start, long end, long step)
{
  int n=Thread::getMaxThreads();
  n=std::min(n, static_cast<int>((end-start+1+step-1)/step));

  if (n > 1)
  {
    Thread *thread=new Thread [n];

    for (int i=0; i<n; i++)
    {
      thread[i].create(fct, start+i*step, end, n*step, -1);
    }

    for (int i=0; i<n; i++)
    {
      thread[i].join();
    }

    delete [] thread;
  }
  else
  {
    fct.run(start, end, step);
  }
}